

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  uint uVar5;
  ImU32 IVar6;
  GetterYs<unsigned_int> *pGVar7;
  TransformerLogLog *pTVar8;
  ImPlotPlot *pIVar9;
  GetterYRef *pGVar10;
  ImDrawVert *pIVar11;
  uint *puVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [12];
  ImPlotContext *pIVar15;
  ImPlotContext *pIVar16;
  int iVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  float fVar22;
  undefined1 auVar21 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  pIVar15 = GImPlot;
  pGVar7 = this->Getter1;
  pTVar8 = this->Transformer;
  iVar17 = pGVar7->Count;
  uVar5 = *(uint *)((long)pGVar7->Ys +
                   (long)(((prim + pGVar7->Offset) % iVar17 + iVar17) % iVar17) *
                   (long)pGVar7->Stride);
  dVar19 = log10((pGVar7->XScale * (double)prim + pGVar7->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar15->CurrentPlot;
  dVar1 = pIVar15->LogDenX;
  dVar2 = (pIVar9->XAxis).Range.Min;
  dVar3 = (pIVar9->XAxis).Range.Max;
  dVar20 = log10((double)uVar5 / pIVar9->YAxis[pTVar8->YAxis].Range.Min);
  pIVar16 = GImPlot;
  iVar17 = pTVar8->YAxis;
  pIVar9 = pIVar15->CurrentPlot;
  auVar30._8_8_ = pIVar15->LogDenY[iVar17];
  auVar30._0_8_ = dVar1;
  pGVar10 = this->Getter2;
  pTVar8 = this->Transformer;
  auVar26._8_8_ = dVar20;
  auVar26._0_8_ = dVar19;
  dVar1 = pGVar10->YRef;
  auVar27 = divpd(auVar26,auVar30);
  dVar19 = pIVar9->YAxis[iVar17].Range.Min;
  IVar4 = pIVar15->PixelRange[iVar17].Min;
  fVar23 = (float)(pIVar15->Mx *
                   (((double)(float)auVar27._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar4.x);
  fVar24 = (float)(pIVar15->My[iVar17] *
                   (((double)(float)auVar27._8_8_ * (pIVar9->YAxis[iVar17].Range.Max - dVar19) +
                    dVar19) - dVar19) + (double)IVar4.y);
  dVar20 = log10(((double)prim * pGVar10->XScale + pGVar10->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar16->CurrentPlot;
  dVar2 = pIVar16->LogDenX;
  dVar3 = (pIVar9->XAxis).Range.Min;
  dVar19 = (pIVar9->XAxis).Range.Max;
  auVar21._0_8_ = log10(dVar1 / pIVar9->YAxis[pTVar8->YAxis].Range.Min);
  iVar17 = pTVar8->YAxis;
  auVar21._8_8_ = dVar20;
  auVar13._8_4_ = SUB84(dVar2,0);
  auVar13._0_8_ = pIVar16->LogDenY[iVar17];
  auVar13._12_4_ = (int)((ulong)dVar2 >> 0x20);
  auVar27 = divpd(auVar21,auVar13);
  pIVar9 = pIVar16->CurrentPlot;
  dVar1 = pIVar9->YAxis[iVar17].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar17].Min;
  fVar18 = (float)(pIVar16->My[iVar17] *
                   (((double)(float)auVar27._0_8_ * (pIVar9->YAxis[iVar17].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar22 = (float)(pIVar16->Mx *
                   (((double)(float)auVar27._8_8_ * (dVar19 - dVar3) + dVar3) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar4.x);
  auVar31._0_4_ = ~-(uint)(fVar22 <= fVar23) & (uint)fVar22;
  auVar31._4_4_ = ~-(uint)(fVar18 <= fVar24) & (uint)fVar18;
  auVar31._8_4_ = ~-(uint)(fVar23 < fVar22) & (uint)fVar22;
  auVar31._12_4_ = ~-(uint)(fVar24 < fVar18) & (uint)fVar18;
  auVar27._4_4_ = (uint)fVar24 & -(uint)(fVar18 <= fVar24);
  auVar27._0_4_ = (uint)fVar23 & -(uint)(fVar22 <= fVar23);
  auVar27._8_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar22);
  auVar27._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar18);
  auVar31 = auVar31 | auVar27;
  fVar25 = (cull_rect->Min).y;
  auVar14._4_8_ = auVar31._8_8_;
  auVar14._0_4_ = -(uint)(auVar31._4_4_ < fVar25);
  auVar32._0_8_ = auVar14._0_8_ << 0x20;
  auVar32._8_4_ = -(uint)(auVar31._8_4_ < (cull_rect->Max).x);
  auVar32._12_4_ = -(uint)(auVar31._12_4_ < (cull_rect->Max).y);
  auVar33._4_4_ = -(uint)(fVar25 < auVar31._4_4_);
  auVar33._0_4_ = -(uint)((cull_rect->Min).x < auVar31._0_4_);
  auVar33._8_8_ = auVar32._8_8_;
  iVar17 = movmskps(iVar17 * 0x10,auVar33);
  if (iVar17 == 0xf) {
    IVar6 = this->Col;
    IVar4 = *uv;
    fVar25 = fVar18 - fVar24;
    fVar28 = fVar22 - fVar23;
    fVar29 = fVar28 * fVar28 + fVar25 * fVar25;
    if (0.0 < fVar29) {
      fVar29 = 1.0 / SQRT(fVar29);
      fVar25 = fVar25 * fVar29;
      fVar28 = fVar28 * fVar29;
    }
    fVar29 = this->Weight * 0.5;
    pIVar11 = DrawList->_VtxWritePtr;
    fVar25 = fVar29 * fVar25;
    fVar29 = fVar29 * fVar28;
    (pIVar11->pos).x = fVar25 + fVar23;
    (pIVar11->pos).y = fVar24 - fVar29;
    (pIVar11->uv).x = IVar4.x;
    (pIVar11->uv).y = IVar4.y;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11->col = IVar6;
    pIVar11[1].pos.x = fVar25 + fVar22;
    pIVar11[1].pos.y = fVar18 - fVar29;
    pIVar11[1].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[1].col = IVar6;
    pIVar11[2].pos.x = fVar22 - fVar25;
    pIVar11[2].pos.y = fVar29 + fVar18;
    pIVar11[2].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[2].col = IVar6;
    pIVar11[3].pos.x = fVar23 - fVar25;
    pIVar11[3].pos.y = fVar29 + fVar24;
    pIVar11[3].uv = IVar4;
    pIVar11 = DrawList->_VtxWritePtr;
    pIVar11[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar11 + 4;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar12 = DrawList->_IdxWritePtr;
    *puVar12 = uVar5;
    puVar12[1] = uVar5 + 1;
    puVar12[2] = DrawList->_VtxCurrentIdx + 2;
    uVar5 = DrawList->_VtxCurrentIdx;
    puVar12[3] = uVar5;
    puVar12[4] = uVar5 + 2;
    puVar12[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar12 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }